

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VInv_Serial(N_Vector x,N_Vector z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 8);
  lVar3 = *(long *)((long)z->content + 8);
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)(lVar3 + uVar5 * 8) = 1.0 / *(double *)(lVar2 + uVar5 * 8);
  }
  return;
}

Assistant:

void N_VInv_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = ONE/xd[i];

  return;
}